

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSAnnotation.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XSAnnotation::writeAnnotation
          (XSAnnotation *this,DOMNode *node,ANNOTATION_TARGET targetType)

{
  XMLCh *src;
  int iVar1;
  int iVar2;
  XercesDOMParser *this_00;
  undefined4 extraout_var;
  MemBufInputSource *this_01;
  XMLSize_t XVar3;
  DOMDocument *pDVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DOMNode *local_88;
  DOMNode *local_78;
  DOMNode *newElem;
  XMLException *anon_var_0;
  MemBufInputSource *memBufIS;
  DOMDocument *futureOwner;
  XercesDOMParser *parser;
  ANNOTATION_TARGET targetType_local;
  DOMNode *node_local;
  XSAnnotation *this_local;
  
  this_00 = (XercesDOMParser *)XMemory::operator_new(0xd8,(this->super_XSObject).fMemoryManager);
  XercesDOMParser::XercesDOMParser
            (this_00,(XMLValidator *)0x0,(this->super_XSObject).fMemoryManager,(XMLGrammarPool *)0x0
            );
  AbstractDOMParser::setDoNamespaces((AbstractDOMParser *)this_00,true);
  AbstractDOMParser::setValidationScheme((AbstractDOMParser *)this_00,Val_Never);
  if (targetType == W3C_DOM_ELEMENT) {
    iVar1 = (*node->_vptr_DOMNode[0xc])();
    local_78 = (DOMNode *)CONCAT44(extraout_var,iVar1);
  }
  else {
    if (node == (DOMNode *)0x0) {
      local_88 = (DOMNode *)0x0;
    }
    else {
      local_88 = node + -3;
    }
    local_78 = local_88;
  }
  this_01 = (MemBufInputSource *)XMemory::operator_new(0x48,(this->super_XSObject).fMemoryManager);
  src = this->fContents;
  XVar3 = XMLString::stringLen(src);
  MemBufInputSource::MemBufInputSource
            (this_01,(XMLByte *)src,XVar3 * 2,"",false,(this->super_XSObject).fMemoryManager);
  (*(this_01->super_InputSource)._vptr_InputSource[7])();
  MemBufInputSource::setCopyBufToStream(this_01,false);
  AbstractDOMParser::parse((AbstractDOMParser *)this_00,(InputSource *)this_01);
  pDVar4 = AbstractDOMParser::getDocument((AbstractDOMParser *)this_00);
  iVar1 = (*(pDVar4->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xd])();
  iVar1 = (*local_78->_vptr_DOMNode[0xf])(local_78,CONCAT44(extraout_var_00,iVar1),1);
  iVar2 = (*node->_vptr_DOMNode[7])();
  (*node->_vptr_DOMNode[0xe])(node,CONCAT44(extraout_var_01,iVar1),CONCAT44(extraout_var_02,iVar2));
  if (this_00 != (XercesDOMParser *)0x0) {
    (*(this_00->super_AbstractDOMParser).super_XMLDocumentHandler._vptr_XMLDocumentHandler[1])();
  }
  if (this_01 != (MemBufInputSource *)0x0) {
    (*(this_01->super_InputSource)._vptr_InputSource[1])();
  }
  return;
}

Assistant:

void XSAnnotation::writeAnnotation(DOMNode* node, ANNOTATION_TARGET targetType)
{
    XercesDOMParser *parser = new (fMemoryManager) XercesDOMParser(0, fMemoryManager);
    parser->setDoNamespaces(true);
    parser->setValidationScheme(XercesDOMParser::Val_Never);

    DOMDocument* futureOwner = (targetType == W3C_DOM_ELEMENT) ?
        ((DOMElement*)node)->getOwnerDocument() :
        (DOMDocument*)node;

    MemBufInputSource* memBufIS = new (fMemoryManager) MemBufInputSource
    (
        (const XMLByte*)fContents
        , XMLString::stringLen(fContents)*sizeof(XMLCh)
        , ""
        , false
        , fMemoryManager
    );
    memBufIS->setEncoding(XMLUni::fgXMLChEncodingString);
    memBufIS->setCopyBufToStream(false);

    try
    {
        parser->parse(*memBufIS);
    }
    catch (const XMLException&)
    {
        // REVISIT:  should we really eat this?
    }

    DOMNode* newElem = futureOwner->importNode((parser->getDocument())->getDocumentElement(), true);
    node->insertBefore(newElem, node->getFirstChild());

    delete parser;
    delete memBufIS;
}